

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
ResolveGenericCommand::trigger(ResolveGenericCommand *this,string_view parameters)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  char *pcVar2;
  ResponseLine *pRVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t local_208;
  char *local_200;
  size_t local_1e0;
  char *local_1d8;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  undefined1 auStack_188 [8];
  string_view resolved_1;
  size_t local_140;
  char *local_138;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  undefined1 auStack_e8 [8];
  string_view resolved;
  string_view subcommand;
  size_t local_78;
  char *local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_t local_58;
  char *local_50;
  undefined1 local_48 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  ResolveGenericCommand *this_local;
  string_view parameters_local;
  
  local_50 = parameters._M_str;
  local_58 = parameters._M_len;
  command_split.second._M_str = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_48,(jessilib *)&local_58,&local_68,in_RCX);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&command_split.first._M_str
                    );
  if (bVar1) {
    parameters_local._M_str = (char *)operator_new(0x30);
    bVar5 = sv("Error: Too few parameters. Syntax: resolve <hostname|ip> <address>",0x42);
    local_78 = bVar5._M_len;
    local_70 = bVar5._M_str;
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              ((ResponseLine *)parameters_local._M_str,local_78,local_70,3);
  }
  else {
    bVar4 = sv("hostname",8);
    bVar5._M_str = (char *)command_split.first._M_len;
    bVar5._M_len = (size_t)local_48;
    bVar1 = jessilib::equalsi<char,char>(bVar5,bVar4);
    if (!bVar1) {
      join_0x00000010_0x00000000_ = sv("host",4);
      bVar4._M_str = (char *)command_split.first._M_len;
      bVar4._M_len = (size_t)local_48;
      bVar1 = jessilib::equalsi<char,char>(bVar4,join_0x00000010_0x00000000_);
      if (!bVar1) {
        join_0x00000010_0x00000000_ = sv("ip",2);
        lhs._M_str = (char *)command_split.first._M_len;
        lhs._M_len = (size_t)local_48;
        bVar1 = jessilib::equalsi<char,char>(lhs,join_0x00000010_0x00000000_);
        if (!bVar1) {
          pRVar3 = (ResponseLine *)operator_new(0x30);
          bVar5 = sv("Error: Invalid type. You can only resolve hostnames and IP addresses.",0x45);
          local_208 = bVar5._M_len;
          local_200 = bVar5._M_str;
          Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,local_208,local_200,3);
          return pRVar3;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_1c8,
                   (basic_string_view<char,_std::char_traits<char>_> *)&command_split.first._M_str,
                   &local_1c9);
        pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(&local_1c8);
        Jupiter::Socket::resolveAddress_abi_cxx11_((char *)local_1a8,(uint)pcVar2);
        _auStack_188 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1a8);
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188);
        if (!bVar1) {
          pRVar3 = (ResponseLine *)operator_new(0x30);
          Jupiter::GenericCommand::ResponseLine::ResponseLine
                    (pRVar3,auStack_188,auStack_188._8_8_,0);
          return pRVar3;
        }
        pRVar3 = (ResponseLine *)operator_new(0x30);
        bVar5 = sv("Error: Unable to resolve.",0x19);
        local_1e0 = bVar5._M_len;
        local_1d8 = bVar5._M_str;
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,local_1e0,local_1d8,2);
        return pRVar3;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_128,
               (basic_string_view<char,_std::char_traits<char>_> *)&command_split.first._M_str,
               &local_129);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_128);
    Jupiter::Socket::resolveHostname_abi_cxx11_((char *)local_108,(uint)pcVar2);
    _auStack_e8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
    if (bVar1) {
      parameters_local._M_str = (char *)operator_new(0x30);
      bVar5 = sv("Error: Unable to resolve.",0x19);
      local_140 = bVar5._M_len;
      local_138 = bVar5._M_str;
      Jupiter::GenericCommand::ResponseLine::ResponseLine
                ((ResponseLine *)parameters_local._M_str,local_140,local_138,2);
    }
    else {
      parameters_local._M_str = (char *)operator_new(0x30);
      Jupiter::GenericCommand::ResponseLine::ResponseLine
                ((ResponseLine *)parameters_local._M_str,auStack_e8,auStack_e8._8_8_,0);
    }
  }
  return (ResponseLine *)parameters_local._M_str;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *ResolveGenericCommand::trigger(std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (command_split.second.empty()) {
		return new Jupiter::GenericCommand::ResponseLine("Error: Too few parameters. Syntax: resolve <hostname|ip> <address>"sv, GenericCommand::DisplayType::PrivateError);
	}

	std::string_view subcommand = command_split.first;
	if (jessilib::equalsi(subcommand, "hostname"sv)
		|| jessilib::equalsi(subcommand, "host"sv))
	{
		std::string_view resolved = Jupiter::Socket::resolveHostname(static_cast<std::string>(command_split.second).c_str(), 0);
		if (resolved.empty())
			return new Jupiter::GenericCommand::ResponseLine("Error: Unable to resolve."sv, GenericCommand::DisplayType::PublicError);
		return new Jupiter::GenericCommand::ResponseLine(resolved, GenericCommand::DisplayType::PublicSuccess);
	}
	else if (jessilib::equalsi(subcommand, "ip"sv))
	{
		std::string_view resolved = Jupiter::Socket::resolveAddress(static_cast<std::string>(command_split.second).c_str(), 0);
		if (resolved.empty())
			return new Jupiter::GenericCommand::ResponseLine("Error: Unable to resolve."sv, GenericCommand::DisplayType::PublicError);
		return new Jupiter::GenericCommand::ResponseLine(resolved, GenericCommand::DisplayType::PublicSuccess);
	}
	return new Jupiter::GenericCommand::ResponseLine("Error: Invalid type. You can only resolve hostnames and IP addresses."sv, GenericCommand::DisplayType::PrivateError);
}